

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrArray.h
# Opt level: O2

void __thiscall
irr::core::array<irr::core::string<unsigned_long>_>::reallocate
          (array<irr::core::string<unsigned_long>_> *this,u32 new_size)

{
  string<unsigned_long> *psVar1;
  ulong *puVar2;
  long lVar3;
  string<unsigned_long> *this_00;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  
  psVar1 = this->data;
  lVar3 = (ulong)new_size * 0x10;
  puVar2 = (ulong *)operator_new__(lVar3 + 8);
  *puVar2 = (ulong)new_size;
  if (new_size != 0) {
    lVar5 = 0;
    this_00 = (string<unsigned_long> *)(puVar2 + 1);
    do {
      string<unsigned_long>::string(this_00);
      lVar5 = lVar5 + -0x10;
      this_00 = this_00 + 1;
    } while (-lVar5 != lVar3);
  }
  this->data = (string<unsigned_long> *)(puVar2 + 1);
  this->allocated = new_size;
  if (this->used < new_size) {
    new_size = this->used;
  }
  uVar6 = 0;
  uVar4 = (ulong)new_size;
  if ((int)new_size < 1) {
    uVar4 = uVar6;
  }
  for (; uVar4 * 0x10 != uVar6; uVar6 = uVar6 + 0x10) {
    string<unsigned_long>::operator=
              ((string<unsigned_long> *)((long)&this->data->array + uVar6),
               (string<unsigned_long> *)((long)&psVar1->array + uVar6));
  }
  if (this->allocated < this->used) {
    this->used = this->allocated;
  }
  if (psVar1 != (string<unsigned_long> *)0x0) {
    lVar3._0_4_ = psVar1[-1].allocated;
    lVar3._4_4_ = psVar1[-1].used;
    if (lVar3 != 0) {
      lVar5 = lVar3 << 4;
      do {
        string<unsigned_long>::~string((string<unsigned_long> *)((long)&psVar1[-1].array + lVar5));
        lVar5 = lVar5 + -0x10;
      } while (lVar5 != 0);
    }
    operator_delete__(&psVar1[-1].allocated,lVar3 << 4 | 8);
    return;
  }
  return;
}

Assistant:

void reallocate(u32 new_size)
	{
		T* old_data = data;

		data = new T[new_size];
		allocated = new_size;
		
		s32 end = used < new_size ? used : new_size;
		for (s32 i=0; i<end; ++i)
			data[i] = old_data[i];

		if (allocated < used)
			used = allocated;
		
		delete [] old_data;
	}